

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,char *src,int32_t length,EInvariant param_3)

{
  UBool UVar1;
  size_t sVar2;
  char16_t *us;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003edbf0
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (src != (char *)0x0) {
    if (length < 0) {
      sVar2 = strlen(src);
      length = (int32_t)sVar2;
    }
    UVar1 = cloneArrayIfNeeded(this,length,length,'\0',(int32_t **)0x0,'\0');
    if (UVar1 == '\0') {
      setToBogus(this);
    }
    else {
      if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        us = (this->fUnion).fFields.fArray;
      }
      else {
        us = (this->fUnion).fStackFields.fBuffer;
      }
      u_charsToUChars_63(src,us,length);
      setLength(this,length);
    }
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(const char *src, int32_t length, EInvariant) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  if(src==NULL) {
    // treat as an empty string
  } else {
    if(length<0) {
      length=(int32_t)uprv_strlen(src);
    }
    if(cloneArrayIfNeeded(length, length, FALSE)) {
      u_charsToUChars(src, getArrayStart(), length);
      setLength(length);
    } else {
      setToBogus();
    }
  }
}